

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

size_t fileTell(file_t file)

{
  size_t sVar1;
  
  sVar1 = ftell((FILE *)file);
  return sVar1;
}

Assistant:

size_t fileTell(file_t file)
{
	long pos;
	ASSERT(fileIsValid(file));
	pos = ftell(file);
	if (pos == -1L || (long)(size_t)pos != pos)
		return SIZE_MAX;
	return (size_t)pos;
}